

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,SCmpREInstr *scmpre)

{
  pointer ppVVar1;
  Value *pVVar2;
  FILE *__stream;
  long lVar3;
  size_t sVar4;
  allocator<char> local_69;
  RegExp local_68;
  
  ppVVar1 = (scmpre->super_Instr).operands_.
            super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar2 = ppVVar1[1];
  if (pVVar2 != (Value *)0x0) {
    lVar3 = __dynamic_cast(pVVar2,&Value::typeinfo,
                           &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::typeinfo,0);
    if (lVar3 != 0) {
      emitLoad(this,*ppVVar1);
      util::RegExp::RegExp(&local_68,(RegExp *)(lVar3 + 0x48));
      sVar4 = ConstantPool::makeRegExp(&this->cp_,&local_68);
      emitInstr(this,SREGMATCH,(Operand)sVar4);
      util::RegExp::~RegExp(&local_68);
      changeStack(this,1,(Value *)scmpre);
      return;
    }
  }
  __stream = _stderr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"flow: RHS must be a ConstantRegExp",&local_69);
  fprintf(__stream,"%s\n",local_68.pattern_._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_68);
  abort();
}

Assistant:

void TargetCodeGenerator::visit(SCmpREInstr& scmpre) {
  auto re = dynamic_cast<ConstantRegExp*>(scmpre.operand(1));
  FLOW_ASSERT(re != nullptr, "flow: RHS must be a ConstantRegExp");

  emitLoad(scmpre.operand(0));
  emitInstr(Opcode::SREGMATCH, cp_.makeRegExp(re->get()));
  changeStack(1, &scmpre);
}